

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

wchar_t write_mtree_entry_tree(archive_write *a)

{
  mtree_writer *mtree_00;
  wchar_t wVar1;
  mtree_entry_conflict *e_1;
  mtree_entry_conflict *e;
  mtree_entry_conflict *pmStack_30;
  wchar_t ret;
  archive_rb_node *n;
  mtree_entry_conflict *np;
  mtree_writer *mtree;
  archive_write *a_local;
  
  mtree_00 = (mtree_writer *)a->format_data;
  n = &mtree_00->root->rbnode;
  do {
    if (mtree_00->output_global_set != L'\0') {
      attr_counter_set_free(mtree_00);
      for (pmStack_30 = (mtree_entry_conflict *)
                        __archive_rb_tree_iterate
                                  ((archive_rb_tree *)n[1].rb_info,(archive_rb_node *)0x0,0);
          pmStack_30 != (mtree_entry_conflict *)0x0;
          pmStack_30 = (mtree_entry_conflict *)
                       __archive_rb_tree_iterate
                                 ((archive_rb_tree *)n[1].rb_info,&pmStack_30->rbnode,1)) {
        wVar1 = attr_counter_set_collect(mtree_00,pmStack_30);
        if (wVar1 < L'\0') {
          archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
          return L'\xffffffe2';
        }
      }
    }
    if ((*(int *)(n[1].rb_info + 0x28) == 0) || (mtree_00->classic != L'\0')) {
      wVar1 = write_mtree_entry(a,(mtree_entry_conflict *)n);
      if (wVar1 != L'\0') {
        return L'\xffffffe2';
      }
    }
    else if (mtree_00->output_global_set != L'\0') {
      write_global(mtree_00);
    }
    mtree_00->depth = mtree_00->depth + L'\x01';
    for (pmStack_30 = (mtree_entry_conflict *)
                      __archive_rb_tree_iterate
                                ((archive_rb_tree *)n[1].rb_info,(archive_rb_node *)0x0,0);
        pmStack_30 != (mtree_entry_conflict *)0x0;
        pmStack_30 = (mtree_entry_conflict *)
                     __archive_rb_tree_iterate
                               ((archive_rb_tree *)n[1].rb_info,&pmStack_30->rbnode,1)) {
      if (pmStack_30->dir_info == (dir_info *)0x0) {
        wVar1 = write_mtree_entry(a,pmStack_30);
        if (wVar1 != L'\0') {
          return L'\xffffffe2';
        }
      }
      else {
        mtree_entry_add_child_tail((mtree_entry_conflict *)n,pmStack_30);
      }
    }
    mtree_00->depth = mtree_00->depth + L'\xffffffff';
    if (*(long *)(n[1].rb_info + 0x10) == 0) {
      if ((mtree_00->classic != L'\0') &&
         (wVar1 = write_dot_dot_entry(a,(mtree_entry_conflict *)n), wVar1 != L'\0')) {
        return L'\xffffffe2';
      }
      for (; n != n[1].rb_nodes[1]; n = n[1].rb_nodes[1]) {
        if (*(long *)(n[1].rb_info + 0x20) != 0) {
          n = *(archive_rb_node **)(n[1].rb_info + 0x20);
          break;
        }
        if (mtree_00->indent != L'\0') {
          mtree_00->depth = mtree_00->depth + L'\xffffffff';
        }
        if ((mtree_00->classic != L'\0') &&
           (wVar1 = write_dot_dot_entry(a,(mtree_entry_conflict *)n[1].rb_nodes[1]), wVar1 != L'\0')
           ) {
          return L'\xffffffe2';
        }
      }
    }
    else {
      n = *(archive_rb_node **)(n[1].rb_info + 0x10);
      if (mtree_00->indent != L'\0') {
        mtree_00->depth = mtree_00->depth + L'\x01';
      }
    }
    if (n == n[1].rb_nodes[1]) {
      return L'\0';
    }
  } while( true );
}

Assistant:

static int
write_mtree_entry_tree(struct archive_write *a)
{
	struct mtree_writer *mtree = a->format_data;
	struct mtree_entry *np = mtree->root;
	struct archive_rb_node *n;
	int ret;

	do {
		if (mtree->output_global_set) {
			/*
			 * Collect attribute information to know which value
			 * is frequently used among the children.
			 */
			attr_counter_set_reset(mtree);
			ARCHIVE_RB_TREE_FOREACH(n, &(np->dir_info->rbtree)) {
				struct mtree_entry *e = (struct mtree_entry *)n;
				if (attr_counter_set_collect(mtree, e) < 0) {
					archive_set_error(&a->archive, ENOMEM,
					    "Can't allocate memory");
					return (ARCHIVE_FATAL);
				}
			}
		}
		if (!np->dir_info->virtual || mtree->classic) {
			ret = write_mtree_entry(a, np);
			if (ret != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
		} else {
			/* Whenever output_global_set is enabled
			 * output global value(/set keywords)
			 * even if the directory entry is not allowed
			 * to be written because the global values
			 * can be used for the children. */
			if (mtree->output_global_set)
				write_global(mtree);
		}
		/*
		 * Output the attribute of all files except directory files.
		 */
		mtree->depth++;
		ARCHIVE_RB_TREE_FOREACH(n, &(np->dir_info->rbtree)) {
			struct mtree_entry *e = (struct mtree_entry *)n;

			if (e->dir_info)
				mtree_entry_add_child_tail(np, e);
			else {
				ret = write_mtree_entry(a, e);
				if (ret != ARCHIVE_OK)
					return (ARCHIVE_FATAL);
			}
		}
		mtree->depth--;

		if (np->dir_info->children.first != NULL) {
			/*
			 * Descend the tree.
			 */
			np = np->dir_info->children.first;
			if (mtree->indent)
				mtree->depth++;
			continue;
		} else if (mtree->classic) {
			/*
			 * While printing mtree classic, if there are not
			 * any directory files(except "." and "..") in the
			 * directory, output two dots ".." as returning
			 * the parent directory.
			 */
			ret = write_dot_dot_entry(a, np);
			if (ret != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
		}

		while (np != np->parent) {
			if (np->dir_info->chnext == NULL) {
				/*
				 * Ascend the tree; go back to the parent.
				 */
				if (mtree->indent)
					mtree->depth--;
				if (mtree->classic) {
					ret = write_dot_dot_entry(a,
						np->parent);
					if (ret != ARCHIVE_OK)
						return (ARCHIVE_FATAL);
				}
				np = np->parent;
			} else {
				/*
				 * Switch to next mtree entry in the directory.
				 */
				np = np->dir_info->chnext;
				break;
			}
		}
	} while (np != np->parent); 

	return (ARCHIVE_OK);
}